

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  long lVar4;
  ostream *poVar5;
  allocator<char> local_219;
  string dir;
  string file;
  string saveFile;
  string local_1b8;
  string makeProgram;
  
  if ((this->FindMakeProgramFile)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&makeProgram,
               "Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,(allocator<char> *)&dir);
    cmSystemTools::Error(&makeProgram);
    std::__cxx11::string::~string((string *)&makeProgram);
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&makeProgram,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&file);
  pcVar2 = cmMakefile::GetDefinition(mf,&makeProgram);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&makeProgram);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dir,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&saveFile);
    pcVar2 = cmMakefile::GetDefinition(mf,&dir);
    bVar1 = cmSystemTools::IsOff(pcVar2);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::~string((string *)&makeProgram);
    if (!bVar1) goto LAB_0029ec7e;
  }
  cmMakefile::GetModulesFile(&makeProgram,mf,&this->FindMakeProgramFile);
  if (makeProgram._M_string_length != 0) {
    cmMakefile::ReadListFile(mf,&makeProgram);
  }
  std::__cxx11::string::~string((string *)&makeProgram);
LAB_0029ec7e:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&makeProgram,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&file);
  pcVar2 = cmMakefile::GetDefinition(mf,&makeProgram);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&makeProgram);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dir,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&saveFile);
    pcVar2 = cmMakefile::GetDefinition(mf,&dir);
    bVar1 = cmSystemTools::IsOff(pcVar2);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::~string((string *)&makeProgram);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dir,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&file);
      psVar3 = cmMakefile::GetRequiredDefinition(mf,&dir);
      std::__cxx11::string::string((string *)&makeProgram,(string *)psVar3);
      std::__cxx11::string::~string((string *)&dir);
      lVar4 = std::__cxx11::string::find((char)&makeProgram,0x20);
      if (lVar4 != -1) {
        dir._M_dataplus._M_p = (pointer)&dir.field_2;
        dir._M_string_length = 0;
        dir.field_2._M_local_buf[0] = '\0';
        file._M_dataplus._M_p = (pointer)&file.field_2;
        file._M_string_length = 0;
        file.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::SplitProgramPath(&makeProgram,&dir,&file,true);
        std::__cxx11::string::string((string *)&saveFile,(string *)&file);
        cmsys::SystemTools::GetShortPath(&makeProgram,&makeProgram);
        cmsys::SystemTools::SplitProgramPath(&makeProgram,&dir,&file,true);
        std::__cxx11::string::_M_assign((string *)&makeProgram);
        std::__cxx11::string::append((char *)&makeProgram);
        std::__cxx11::string::append((string *)&makeProgram);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"CMAKE_MAKE_PROGRAM",&local_219);
        cmMakefile::AddCacheDefinition
                  (mf,&local_1b8,makeProgram._M_dataplus._M_p,"make program",FILEPATH,false);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&saveFile);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::~string((string *)&dir);
      }
      std::__cxx11::string::~string((string *)&makeProgram);
      return true;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&makeProgram);
  poVar5 = std::operator<<((ostream *)&makeProgram,
                           "CMake was unable to find a build program corresponding to \"");
  (*this->_vptr_cmGlobalGenerator[3])(&dir,this);
  poVar5 = std::operator<<(poVar5,(string *)&dir);
  poVar5 = std::operator<<(poVar5,"\".  CMAKE_MAKE_PROGRAM is not set.  You ");
  std::operator<<(poVar5,"probably need to select a different build tool.");
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&dir);
  std::__cxx11::string::~string((string *)&dir);
  cmSystemTools::s_FatalErrorOccured = true;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&makeProgram);
  return false;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}